

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aes.c
# Opt level: O0

int aes_ccm_init_key(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  AES_KEY *key_00;
  void *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  EVP_AES_CCM_CTX *cctx;
  EVP_CIPHER_CTX *in_stack_00000050;
  block128_f in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  key_00 = (AES_KEY *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  if ((in_RDX != (void *)0x0) || (in_RSI != (uchar *)0x0)) {
    if (in_RSI != (uchar *)0x0) {
      if ((DAT_005e9d1c & 0x200) == 0) {
        iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
        AES_set_encrypt_key(in_RSI,iVar1 << 3,key_00);
        CRYPTO_ccm128_init((CCM128_CONTEXT *)key_00,(uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                           ,(uint)in_stack_ffffffffffffffc8,in_RSI,in_stack_ffffffffffffffb8);
        key_00[1].rd_key[0x17] = 0;
        key_00[1].rd_key[0x18] = 0;
        key_00[1].rd_key[1] = 1;
      }
      else {
        iVar1 = EVP_CIPHER_CTX_get_key_length(in_stack_00000050);
        vpaes_set_encrypt_key(in_RSI,iVar1 << 3,key_00);
        CRYPTO_ccm128_init((CCM128_CONTEXT *)key_00,(uint)((ulong)in_RSI >> 0x20),(uint)in_RSI,
                           in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        key_00[1].rd_key[0x17] = 0;
        key_00[1].rd_key[0x18] = 0;
        key_00[1].rd_key[1] = 1;
      }
    }
    if (in_RDX != (void *)0x0) {
      memcpy(in_RDI->iv,in_RDX,(long)(int)(0xf - key_00[1].rd_key[5]));
      key_00[1].rd_key[2] = 1;
    }
  }
  return 1;
}

Assistant:

static int aes_ccm_init_key(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                            const unsigned char *iv, int enc)
{
    EVP_AES_CCM_CTX *cctx = EVP_C_DATA(EVP_AES_CCM_CTX,ctx);
    if (!iv && !key)
        return 1;
    if (key)
        do {
#ifdef HWAES_CAPABLE
            if (HWAES_CAPABLE) {
                HWAES_set_encrypt_key(key,
                                      EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                      &cctx->ks.ks);

                CRYPTO_ccm128_init(&cctx->ccm, cctx->M, cctx->L,
                                   &cctx->ks, (block128_f) HWAES_encrypt);
                cctx->str = NULL;
                cctx->key_set = 1;
                break;
            } else
#endif
#ifdef VPAES_CAPABLE
            if (VPAES_CAPABLE) {
                vpaes_set_encrypt_key(key,
                                      EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                      &cctx->ks.ks);
                CRYPTO_ccm128_init(&cctx->ccm, cctx->M, cctx->L,
                                   &cctx->ks, (block128_f) vpaes_encrypt);
                cctx->str = NULL;
                cctx->key_set = 1;
                break;
            }
#endif
            AES_set_encrypt_key(key, EVP_CIPHER_CTX_get_key_length(ctx) * 8,
                                &cctx->ks.ks);
            CRYPTO_ccm128_init(&cctx->ccm, cctx->M, cctx->L,
                               &cctx->ks, (block128_f) AES_encrypt);
            cctx->str = NULL;
            cctx->key_set = 1;
        } while (0);
    if (iv) {
        memcpy(ctx->iv, iv, 15 - cctx->L);
        cctx->iv_set = 1;
    }
    return 1;
}